

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int vs_search_start(bitstream *str)

{
  uint8_t uVar1;
  vs_type vVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  uint32_t bit;
  uint32_t local_1c;
  
  if (str->dir == VS_DECODE) {
    vVar2 = str->type;
    if ((vVar2 & ~VS_H263) == VS_H261) {
      local_1c = 0;
      do {
        if ((str->hasbyte == 0) && (str->bytesnum <= str->bytepos)) break;
        if ((int)(0x10 - (uint)(vVar2 == VS_H261)) <= str->zero_bits) {
          return 1;
        }
        iVar3 = vs_bit(str,&local_1c);
      } while (iVar3 == 0);
    }
    else {
      str->hasbyte = 0;
      str->bitpos = 7;
      iVar3 = str->bytepos;
      if (iVar3 < str->bytesnum) {
        puVar4 = str->bytes + iVar3;
        iVar5 = str->zero_bytes;
        do {
          iVar3 = iVar3 + 1;
          uVar1 = *puVar4;
          if (iVar5 == 2) {
            iVar5 = 2;
            if (uVar1 != '\0') {
              iVar5 = 0;
              if (uVar1 == '\x01') {
                return 1;
              }
              goto LAB_0010295c;
            }
          }
          else {
            iVar5 = iVar5 + 1;
            if (uVar1 != '\0') {
              iVar5 = 0;
            }
LAB_0010295c:
            str->zero_bytes = iVar5;
          }
          str->bytepos = iVar3;
          puVar4 = puVar4 + 1;
        } while (iVar3 != str->bytesnum);
      }
    }
    iVar3 = 0;
  }
  else {
    vs_search_start_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int vs_search_start(struct bitstream *str) {
	if (str->dir != VS_DECODE) {
		fprintf (stderr, "vs_search_start called in encode mode!\n");
		return -1;
	}
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		uint32_t bit = 0;

		while (1) {
			if (!str->hasbyte && str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bits >= nzbit)
				return 1;
			if (vs_bit(str, &bit)) return 0;
		}
	} else {
		str->hasbyte = 0;
		str->bitpos = 7;
		while (1) {
			if (str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bytes == 2 && str->bytes[str->bytepos] == 1)
				return 1;
			if (str->bytes[str->bytepos] == 0) {
				if (str->zero_bytes != 2)
					str->zero_bytes++;
			} else {
				str->zero_bytes = 0;
			}
			str->bytepos++;
		}
	}
}